

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

void remove_option(mtree_option **global,char *value,size_t len)

{
  mtree_option *pmVar1;
  int iVar2;
  mtree_option *__ptr;
  mtree_option *pmVar3;
  char *__s1;
  
  if (*global != (mtree_option *)0x0) {
    pmVar1 = *global;
    pmVar3 = (mtree_option *)0x0;
    do {
      __ptr = pmVar1;
      __s1 = __ptr->value;
      iVar2 = strncmp(__s1,value,len);
      if ((iVar2 == 0) && ((__s1[len] == '\0' || (__s1[len] == '=')))) {
        if (pmVar3 == (mtree_option *)0x0) {
          *global = __ptr->next;
          __s1 = __ptr->value;
        }
        else {
          pmVar3->next = __ptr->next;
        }
        free(__s1);
        free(__ptr);
        return;
      }
      pmVar1 = __ptr->next;
      pmVar3 = __ptr;
    } while (__ptr->next != (mtree_option *)0x0);
  }
  return;
}

Assistant:

static void
remove_option(struct mtree_option **global, const char *value, size_t len)
{
	struct mtree_option *iter, *last;

	last = NULL;
	for (iter = *global; iter != NULL; last = iter, iter = iter->next) {
		if (strncmp(iter->value, value, len) == 0 &&
		    (iter->value[len] == '\0' ||
		     iter->value[len] == '='))
			break;
	}
	if (iter == NULL)
		return;
	if (last == NULL)
		*global = iter->next;
	else
		last->next = iter->next;

	free(iter->value);
	free(iter);
}